

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
pstore::small_vector<pstore::command_line::literal,_3UL>::switch_to_big
          (small_vector<pstore::command_line::literal,_3UL> *this,size_t new_elements)

{
  vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_> *this_00;
  pointer plVar1;
  literal *__x;
  long lVar2;
  
  this_00 = &this->big_buffer_;
  std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::
  _M_erase_at_end(this_00,(this->big_buffer_).
                          super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::
  reserve(this_00,new_elements);
  if (0 < (long)this->elements_) {
    __x = this->buffer_;
    lVar2 = this->elements_ + 1;
    do {
      std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>::
      push_back(this_00,__x);
      __x = __x + 1;
      lVar2 = lVar2 + -1;
    } while (1 < lVar2);
  }
  if (new_elements < 4) {
    plVar1 = (this->small_buffer_)._M_elems;
  }
  else {
    plVar1 = (this->big_buffer_).
             super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  this->buffer_ = plVar1;
  return;
}

Assistant:

void small_vector<ElementType, BodyElements>::switch_to_big (std::size_t new_elements) {
        big_buffer_.clear ();
        big_buffer_.reserve (new_elements);
        std::copy (buffer_, buffer_ + elements_, std::back_inserter (big_buffer_));
        this->set_buffer_ptr (new_elements);
    }